

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::handleSignal(int sig)

{
  int in_EDI;
  SignalDefs *def;
  SignalDefs *__end1;
  SignalDefs *__begin1;
  SignalDefs (*__range1) [6];
  char *name;
  char **message;
  
  for (message = (char **)&signalDefs;
      (message != &trim::whitespaceChars && (in_EDI != *(int *)message)); message = message + 2) {
  }
  restorePreviousSignalHandlers();
  anon_unknown.dwarf_9346f::reportFatal((char *)message);
  raise(in_EDI);
  return;
}

Assistant:

static void handleSignal( int sig ) {
        char const * name = "<unknown signal>";
        for (auto const& def : signalDefs) {
            if (sig == def.id) {
                name = def.name;
                break;
            }
        }
        // We need to restore previous signal handlers and let them do
        // their thing, so that the users can have the debugger break
        // when a signal is raised, and so on.
        restorePreviousSignalHandlers();
        reportFatal( name );
        raise( sig );
    }